

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O1

void __thiscall LatencyCollector::~LatencyCollector(LatencyCollector *this)

{
  MapWrapper::freeAllItems((((this->latestMap).object._M_b._M_p)->ptr)._M_b._M_p);
  ashared_ptr<MapWrapper>::reset(&this->latestMap);
  return;
}

Assistant:

~LatencyCollector() {
        latestMap->freeAllItems();
    }